

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::ReadPixels::exec(ReadPixels *this,Thread *t)

{
  ostream *this_00;
  deUint32 err;
  Thread *pTVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar1 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar1 != (Thread *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_1c8,(long)((this->m_height - this->m_y) * (this->m_width - this->m_x) * 4),
               (allocator_type *)local_1b0);
    local_1b0._0_8_ = pTVar1;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    this_00 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Begin -- glReadPixels(",0x16);
    std::ostream::operator<<(this_00,this->m_x);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    std::ostream::operator<<(this_00,this->m_y);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    std::ostream::operator<<(this_00,this->m_width);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    std::ostream::operator<<(this_00,this->m_height);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", <data>)",9);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    (**(code **)(*(long *)&pTVar1[1].super_Thread.m_attribs + 0x1220))
              (this->m_x,this->m_y,this->m_width,this->m_height,this->m_format,this->m_type,
               local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    err = (**(code **)(*(long *)&pTVar1[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"readPixels(m_x, m_y, m_width, m_height, m_format, m_type, &(data[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x74f);
    local_1b0._0_8_ = pTVar1;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"End -- glReadPixels()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    tcu::ThreadUtil::DataBlock::setData
              ((this->m_data).m_ptr,
               (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void ReadPixels::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	DE_ASSERT(m_type == GL_UNSIGNED_BYTE);
	DE_ASSERT(m_format == GL_RGBA);

	std::vector<deUint8> data((m_width-m_x)*(m_height-m_y)*4);

	thread.newMessage() << "Begin -- glReadPixels(" << m_x << ", " << m_y << ", " << m_width << ", " << m_height << ", " << m_format << ", " << m_type << ", <data>)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, readPixels(m_x, m_y, m_width, m_height, m_format, m_type, &(data[0])));
	thread.newMessage() << "End -- glReadPixels()" << tcu::ThreadUtil::Message::End;

	m_data->setData(data.size(), &(data[0]));
}